

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFindPackageCommand::SetModuleVariables
          (cmFindPackageCommand *this,string *components,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
          *componentVarDefs)

{
  pointer pcVar1;
  pointer ppVar2;
  size_t sVar3;
  char *pcVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *varDef;
  pointer var;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view sVar5;
  string quietly;
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  char *local_a0;
  undefined8 local_98;
  string exact;
  string components_var;
  string local_50;
  
  local_c0._M_unused._M_object = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"CMAKE_FIND_PACKAGE_NAME","");
  sVar5._M_str = (this->Name)._M_dataplus._M_p;
  sVar5._M_len = (this->Name)._M_string_length;
  AddFindDefinition(this,(string *)&local_c0,sVar5);
  if ((code **)local_c0._M_unused._0_8_ != &local_b0) {
    operator_delete(local_c0._M_unused._M_object,(ulong)(local_b0 + 1));
  }
  pcVar1 = (this->Name)._M_dataplus._M_p;
  components_var._M_dataplus._M_p = (pointer)&components_var.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&components_var,pcVar1,pcVar1 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&components_var);
  value._M_str = (components->_M_dataplus)._M_p;
  value._M_len = components->_M_string_length;
  AddFindDefinition(this,&components_var,value);
  ppVar2 = (componentVarDefs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (var = (componentVarDefs->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
             )._M_impl.super__Vector_impl_data._M_start; var != ppVar2; var = var + 1) {
    pcVar4 = var->second;
    sVar3 = strlen(pcVar4);
    value_00._M_str = pcVar4;
    value_00._M_len = sVar3;
    AddFindDefinition(this,&var->first,value_00);
  }
  if (this->Quiet != false) {
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0xd;
    local_a0 = "_FIND_QUIETLY";
    local_98 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_c0;
    cmCatViews(&quietly,views);
    value_01._M_str = "1";
    value_01._M_len = 1;
    AddFindDefinition(this,&quietly,value_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_) !=
        &quietly.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_),
                      quietly.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->Required == true) {
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0xe;
    local_a0 = "_FIND_REQUIRED";
    local_98 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_c0;
    cmCatViews(&quietly,views_00);
    value_02._M_str = "1";
    value_02._M_len = 1;
    AddFindDefinition(this,&quietly,value_02);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_) !=
        &quietly.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_),
                      quietly.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->VersionComplete)._M_string_length != 0) {
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0x16;
    local_a0 = "_FIND_VERSION_COMPLETE";
    local_98 = 0;
    views_01._M_len = 2;
    views_01._M_array = (iterator)&local_c0;
    cmCatViews(&quietly,views_01);
    value_03._M_str = (this->VersionComplete)._M_dataplus._M_p;
    value_03._M_len = (this->VersionComplete)._M_string_length;
    AddFindDefinition(this,&quietly,value_03);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_) !=
        &quietly.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_),
                      quietly.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->Version)._M_string_length != 0) {
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0xd;
    local_a0 = "_FIND_VERSION";
    local_98 = 0;
    views_02._M_len = 2;
    views_02._M_array = (iterator)&local_c0;
    cmCatViews(&quietly,views_02);
    local_c0._8_8_ = 0;
    local_a8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
               ::_M_invoke;
    local_b0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
               ::_M_manager;
    local_c0._M_unused._M_object = this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&local_c0,&quietly,&this->Version,this->VersionCount,this->VersionMajor,
                        this->VersionMinor,this->VersionPatch,this->VersionTweak);
    if (local_b0 != (code *)0x0) {
      (*local_b0)(&local_c0,&local_c0,3);
    }
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0x13;
    local_a0 = "_FIND_VERSION_EXACT";
    local_98 = 0;
    views_03._M_len = 2;
    views_03._M_array = (iterator)&local_c0;
    cmCatViews(&exact,views_03);
    pcVar4 = "0";
    if (this->VersionExact != false) {
      pcVar4 = "1";
    }
    value_04._M_str = pcVar4;
    value_04._M_len = 1;
    AddFindDefinition(this,&exact,value_04);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)exact._M_dataplus._M_p != &exact.field_2) {
      operator_delete(exact._M_dataplus._M_p,exact.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_) !=
        &quietly.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_),
                      quietly.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->VersionRange)._M_string_length != 0) {
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0x11;
    local_a0 = "_FIND_VERSION_MIN";
    local_98 = 0;
    views_04._M_len = 2;
    views_04._M_array = (iterator)&local_c0;
    cmCatViews(&quietly,views_04);
    local_c0._8_8_ = 0;
    local_a8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
               ::_M_invoke;
    local_b0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
               ::_M_manager;
    local_c0._M_unused._M_object = this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&local_c0,&quietly,&this->Version,this->VersionCount,this->VersionMajor,
                        this->VersionMinor,this->VersionPatch,this->VersionTweak);
    if (local_b0 != (code *)0x0) {
      (*local_b0)(&local_c0,&local_c0,3);
    }
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0x11;
    local_a0 = "_FIND_VERSION_MAX";
    local_98 = 0;
    views_05._M_len = 2;
    views_05._M_array = (iterator)&local_c0;
    cmCatViews(&exact,views_05);
    std::__cxx11::string::operator=((string *)&quietly,(string *)&exact);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)exact._M_dataplus._M_p != &exact.field_2) {
      operator_delete(exact._M_dataplus._M_p,exact.field_2._M_allocated_capacity + 1);
    }
    local_c0._8_8_ = 0;
    local_a8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
               ::_M_invoke;
    local_b0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:1280:24)>
               ::_M_manager;
    local_c0._M_unused._M_object = this;
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionMaxPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&local_c0,&quietly,&this->VersionMax,this->VersionMaxCount,
                        this->VersionMaxMajor,this->VersionMaxMinor,this->VersionMaxPatch,
                        this->VersionMaxTweak);
    if (local_b0 != (code *)0x0) {
      (*local_b0)(&local_c0,&local_c0,3);
    }
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0x13;
    local_a0 = "_FIND_VERSION_RANGE";
    local_98 = 0;
    views_06._M_len = 2;
    views_06._M_array = (iterator)&local_c0;
    cmCatViews(&exact,views_06);
    value_05._M_str = (this->VersionRange)._M_dataplus._M_p;
    value_05._M_len = (this->VersionRange)._M_string_length;
    AddFindDefinition(this,&exact,value_05);
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0x17;
    local_a0 = "_FIND_VERSION_RANGE_MIN";
    local_98 = 0;
    views_07._M_len = 2;
    views_07._M_array = (iterator)&local_c0;
    cmCatViews(&local_50,views_07);
    std::__cxx11::string::operator=((string *)&exact,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    AddFindDefinition(this,&exact,this->VersionRangeMin);
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0x17;
    local_a0 = "_FIND_VERSION_RANGE_MAX";
    local_98 = 0;
    views_08._M_len = 2;
    views_08._M_array = (iterator)&local_c0;
    cmCatViews(&local_50,views_08);
    std::__cxx11::string::operator=((string *)&exact,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    AddFindDefinition(this,&exact,this->VersionRangeMax);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)exact._M_dataplus._M_p != &exact.field_2) {
      operator_delete(exact._M_dataplus._M_p,exact.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_) !=
        &quietly.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_),
                      quietly.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->RegistryViewDefined == true) {
    local_c0._8_8_ = (this->Name)._M_dataplus._M_p;
    local_c0._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
    local_b0 = (code *)0x0;
    local_a8 = (code *)0x13;
    local_a0 = "_FIND_REGISTRY_VIEW";
    local_98 = 0;
    views_09._M_len = 2;
    views_09._M_array = (iterator)&local_c0;
    cmCatViews(&quietly,views_09);
    sVar5 = cmWindowsRegistry::FromView(quietly._M_dataplus._M_p._4_4_);
    AddFindDefinition(this,&quietly,sVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_) !=
        &quietly.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(quietly._M_dataplus._M_p._4_4_,quietly._M_dataplus._M_p._0_4_),
                      quietly.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)components_var._M_dataplus._M_p != &components_var.field_2) {
    operator_delete(components_var._M_dataplus._M_p,components_var.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void cmFindPackageCommand::SetModuleVariables(
  const std::string& components,
  const std::vector<std::pair<std::string, const char*>>& componentVarDefs)
{
  this->AddFindDefinition("CMAKE_FIND_PACKAGE_NAME", this->Name);

  // Store the list of components and associated variable definitions
  std::string components_var = this->Name + "_FIND_COMPONENTS";
  this->AddFindDefinition(components_var, components);
  for (const auto& varDef : componentVarDefs) {
    this->AddFindDefinition(varDef.first, varDef.second);
  }

  if (this->Quiet) {
    // Tell the module that is about to be read that it should find
    // quietly.
    std::string quietly = cmStrCat(this->Name, "_FIND_QUIETLY");
    this->AddFindDefinition(quietly, "1"_s);
  }

  if (this->Required) {
    // Tell the module that is about to be read that it should report
    // a fatal error if the package is not found.
    std::string req = cmStrCat(this->Name, "_FIND_REQUIRED");
    this->AddFindDefinition(req, "1"_s);
  }

  if (!this->VersionComplete.empty()) {
    std::string req = cmStrCat(this->Name, "_FIND_VERSION_COMPLETE");
    this->AddFindDefinition(req, this->VersionComplete);
  }

  // Tell the module that is about to be read what version of the
  // package has been requested.
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->AddFindDefinition(variable, value);
  };

  if (!this->Version.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    // Tell the module whether an exact version has been requested.
    auto exact = cmStrCat(this->Name, "_FIND_VERSION_EXACT");
    this->AddFindDefinition(exact, this->VersionExact ? "1"_s : "0"_s);
  }
  if (!this->VersionRange.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION_MIN"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    prefix = cmStrCat(this->Name, "_FIND_VERSION_MAX"_s);
    this->SetVersionVariables(addDefinition, prefix, this->VersionMax,
                              this->VersionMaxCount, this->VersionMaxMajor,
                              this->VersionMaxMinor, this->VersionMaxPatch,
                              this->VersionMaxTweak);

    auto id = cmStrCat(this->Name, "_FIND_VERSION_RANGE");
    this->AddFindDefinition(id, this->VersionRange);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MIN");
    this->AddFindDefinition(id, this->VersionRangeMin);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MAX");
    this->AddFindDefinition(id, this->VersionRangeMax);
  }

  if (this->RegistryViewDefined) {
    this->AddFindDefinition(cmStrCat(this->Name, "_FIND_REGISTRY_VIEW"),
                            cmWindowsRegistry::FromView(this->RegistryView));
  }
}